

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BEREncode.cpp
# Opt level: O0

int __thiscall Counter64::serialise(Counter64 *this,uint8_t *buf,size_t max_len)

{
  uint8_t *puVar1;
  uint8_t *ptr;
  int i;
  size_t max_len_local;
  uint8_t *buf_local;
  Counter64 *this_local;
  
  this_local._4_4_ = BER_CONTAINER::serialise(&this->super_BER_CONTAINER,buf,max_len,8);
  if (-1 < this_local._4_4_) {
    puVar1 = buf + this_local._4_4_;
    *puVar1 = (uint8_t)(this->_value >> 0x38);
    puVar1[1] = (uint8_t)(this->_value >> 0x30);
    puVar1[2] = (uint8_t)(this->_value >> 0x28);
    puVar1[3] = (uint8_t)(this->_value >> 0x20);
    puVar1[4] = (uint8_t)(this->_value >> 0x18);
    puVar1[5] = (uint8_t)(this->_value >> 0x10);
    puVar1[6] = (uint8_t)(this->_value >> 8);
    puVar1[7] = (uint8_t)this->_value;
    this_local._4_4_ = ((int)puVar1 + 8) - (int)buf;
  }
  return this_local._4_4_;
}

Assistant:

int Counter64::serialise(uint8_t* buf, size_t max_len){
    int i = BER_CONTAINER::serialise(buf, max_len, 8);
    CHECK_ENCODE_ERR(i);
    uint8_t *ptr = buf + i;

    *ptr++ = _value >> 56 & 0xFF;
    *ptr++ = _value >> 48 & 0xFF;
    *ptr++ = _value >> 40 & 0xFF;
    *ptr++ = _value >> 32 & 0xFF;
    *ptr++ = _value >> 24 & 0xFF;
    *ptr++ = _value >> 16 & 0xFF;
    *ptr++ = _value >> 8 & 0xFF;
    *ptr++ = _value & 0xFF;
    
    return ptr - buf;
}